

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_components.c
# Opt level: O0

void key_components_add_copy(key_components *kc,char *name,key_component *value)

{
  KeyComponentType type;
  ptrlen data;
  key_component *value_local;
  char *name_local;
  key_components *kc_local;
  
  if (value->type < KCT_MPINT) {
    type = value->type;
    data = ptrlen_from_strbuf((value->field_2).str);
    key_components_add_str(kc,name,type,data);
  }
  else if (value->type == KCT_MPINT) {
    key_components_add_mp(kc,name,(value->field_2).mp);
  }
  return;
}

Assistant:

void key_components_add_copy(key_components *kc,
                             const char *name, const key_component *value)
{
    switch (value->type) {
      case KCT_TEXT:
      case KCT_BINARY:
        key_components_add_str(kc, name, value->type,
                               ptrlen_from_strbuf(value->str));
        break;
      case KCT_MPINT:
        key_components_add_mp(kc, name, value->mp);
        break;
    }
}